

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScatterAlongAxisLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  undefined1 auStack_38 [40];
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)auStack_38,layer,3,3);
  Result::operator=(__return_storage_ptr__,(Result *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)auStack_38,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)auStack_38);
    std::__cxx11::string::~string((string *)(auStack_38 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScatterAlongAxisLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 3, 3);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    return r;
}